

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void QSslSocketPrivate::checkSettingSslContext
               (QSslSocket *socket,shared_ptr<QSslContext> tlsContext)

{
  long *plVar1;
  long in_FS_OFFSET;
  __shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((socket != (QSslSocket *)0x0) &&
     (plVar1 = *(long **)(*(long *)&(socket->super_QTcpSocket).super_QAbstractSocket.field_0x8 +
                         0x408), plVar1 != (long *)0x0)) {
    std::__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_28,
               (__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2> *)
               tlsContext.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (**(code **)(*plVar1 + 0x68))(plVar1,&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::checkSettingSslContext(QSslSocket* socket, std::shared_ptr<QSslContext> tlsContext)
{
    if (!socket)
        return;

    if (auto *backend = socket->d_func()->backend.get())
        backend->checkSettingSslContext(tlsContext);
}